

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

bool __thiscall QTextCursor::operator>(QTextCursor *this,QTextCursor *rhs)

{
  int iVar1;
  bool bVar2;
  QTextCursorPrivate *pQVar3;
  bool local_1;
  
  bVar2 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6c91);
  if (bVar2) {
    local_1 = false;
  }
  else {
    bVar2 = QSharedDataPointer<QTextCursorPrivate>::operator!
                      ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6ca8);
    if (bVar2) {
      local_1 = true;
    }
    else {
      pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6cbf);
      iVar1 = pQVar3->position;
      pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6cd0);
      local_1 = pQVar3->position < iVar1;
    }
  }
  return local_1;
}

Assistant:

bool QTextCursor::operator>(const QTextCursor &rhs) const
{
    if (!d)
        return false;

    if (!rhs.d)
        return true;

    Q_ASSERT_X(d->priv == rhs.d->priv, "QTextCursor::operator>", "cannot compare cursors attached to different documents");

    return d->position > rhs.d->position;
}